

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalTestNamer.cpp
# Opt level: O2

TestName * ApprovalTests::ApprovalTestNamer::currentTest(TestName *value)

{
  TestName *pTVar1;
  runtime_error *this;
  
  pTVar1 = value;
  if ((value == (TestName *)0x0) &&
     (pTVar1 = currentTest::staticValue, currentTest::staticValue == (TestName *)0x0)) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(this,"The variable in currentTest() is not initialised");
    __cxa_throw(this,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  currentTest::staticValue = pTVar1;
  return currentTest::staticValue;
}

Assistant:

TestName& ApprovalTestNamer::currentTest(TestName* value)
    {
        static TestName* staticValue;
        if (value != nullptr)
        {
            staticValue = value;
        }
        if (staticValue == nullptr)
        {
            throw std::runtime_error("The variable in currentTest() is not initialised");
        }
        return *staticValue;
    }